

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

Path * __thiscall fs::Path::setFile(Path *this,string *file)

{
  pointer pcVar1;
  size_type sVar2;
  size_type sVar3;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  std::__cxx11::string::assign((char *)&this->_extension,0);
  sVar2 = std::__cxx11::string::rfind((char)file,0x2e);
  if (sVar2 == 0) {
    std::__cxx11::string::_M_assign((string *)&this->_stem);
  }
  else {
    pcVar1 = (file->_M_dataplus)._M_p;
    sVar3 = sVar2;
    if (sVar2 == 0xffffffffffffffff) {
      sVar3 = file->_M_string_length;
    }
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,pcVar1,pcVar1 + sVar3);
    std::__cxx11::string::operator=((string *)&this->_stem,(string *)local_50);
    std::__cxx11::string::~string((string *)local_50);
    if (sVar2 != 0xffffffffffffffff) {
      pcVar1 = (file->_M_dataplus)._M_p;
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,pcVar1 + sVar2,pcVar1 + file->_M_string_length);
      std::__cxx11::string::operator=((string *)&this->_extension,(string *)local_50);
      std::__cxx11::string::~string((string *)local_50);
    }
  }
  updateFile(this);
  return this;
}

Assistant:

fs::Path& fs::Path::setFile(std::string const& file)
{
  _extension = {};
  auto ext = file.find_last_of('.');
  if (ext != 0)
  {
    _stem = std::string (&file[0], &file[ext == file.npos ? file.size() : ext]);
    if (ext != file.npos)
    {
      _extension = std::string (&file[ext], &file[file.size()]);
    }
  }
  else
  {
    _stem = file;
  }
  updateFile();
  return *this;
}